

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

int SET_OF_constraint(asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
                     void *app_key)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  int iVar3;
  int unaff_EBP;
  asn_constr_check_f *paVar4;
  long lVar5;
  bool bVar6;
  
  if (sptr == (void *)0x0) {
    iVar3 = -1;
    if (ctfailcb != (asn_app_constraint_failed_f *)0x0) {
      (*ctfailcb)(app_key,td,(void *)0x0,"%s: value not given (%s:%d)",td->name,
                  "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/constr_SET_OF.c"
                  ,0x344);
    }
  }
  else {
    paVar1 = td->elements;
    paVar4 = paVar1->memb_constraints;
    if (paVar4 == (asn_constr_check_f *)0x0) {
      paVar4 = paVar1->type->check_constraints;
    }
    if (0 < *(int *)((long)sptr + 8)) {
      lVar5 = 0;
      do {
        pvVar2 = *(void **)(*sptr + lVar5 * 8);
        if (pvVar2 == (void *)0x0) {
          bVar6 = false;
        }
        else {
          iVar3 = (*paVar4)(paVar1->type,pvVar2,ctfailcb,app_key);
          bVar6 = iVar3 != 0;
          if (bVar6) {
            unaff_EBP = iVar3;
          }
        }
        if (bVar6) {
          return unaff_EBP;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(int *)((long)sptr + 8));
    }
    iVar3 = 0;
    if (paVar1->memb_constraints == (asn_constr_check_f *)0x0) {
      paVar1->memb_constraints = paVar1->type->check_constraints;
    }
  }
  return iVar3;
}

Assistant:

int
SET_OF_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
		asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	asn_TYPE_member_t *elm = td->elements;
	asn_constr_check_f *constr;
	const asn_anonymous_set_ *list = _A_CSET_FROM_VOID(sptr);
	int i;

	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}

	constr = elm->memb_constraints;
	if(!constr) constr = elm->type->check_constraints;

	/*
	 * Iterate over the members of an array.
	 * Validate each in turn, until one fails.
	 */
	for(i = 0; i < list->count; i++) {
		const void *memb_ptr = list->array[i];
		int ret;

		if(!memb_ptr) continue;

		ret = constr(elm->type, memb_ptr, ctfailcb, app_key);
		if(ret) return ret;
	}

	/*
	 * Cannot inherit it eralier:
	 * need to make sure we get the updated version.
	 */
	if(!elm->memb_constraints)
		elm->memb_constraints = elm->type->check_constraints;

	return 0;
}